

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_tt.c
# Opt level: O0

HPDF_FontDef HPDF_TTFontDef_New(HPDF_MMgr mmgr)

{
  HPDF_Alloc_Func s;
  HPDF_TTFontDefAttr fontdef_attr;
  HPDF_FontDef fontdef;
  HPDF_MMgr mmgr_local;
  
  if (mmgr == (HPDF_MMgr)0x0) {
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    mmgr_local = (HPDF_MMgr)HPDF_GetMem(mmgr,0x100);
    if (mmgr_local == (HPDF_MMgr)0x0) {
      mmgr_local = (HPDF_MMgr)0x0;
    }
    else {
      HPDF_MemSet(mmgr_local,'\0',0x100);
      *(undefined4 *)&mmgr_local->error = 0x464f4e54;
      mmgr_local[3].free_fn = (HPDF_Free_Func)mmgr;
      mmgr_local[3].mpool = (HPDF_MPool_Node_conflict)mmgr->error;
      mmgr_local[3].buf_size = 1;
      mmgr_local[4].error = (HPDF_Error)CleanFunc;
      mmgr_local[4].alloc_fn = FreeFunc;
      s = (HPDF_Alloc_Func)HPDF_GetMem(mmgr,0x1b0);
      if (s == (HPDF_Alloc_Func)0x0) {
        HPDF_FreeMem((HPDF_MMgr)mmgr_local[3].free_fn,mmgr_local);
        mmgr_local = (HPDF_MMgr)0x0;
      }
      else {
        mmgr_local[6].alloc_fn = s;
        HPDF_MemSet(s,'\0',0x1b0);
        *(undefined4 *)((long)&mmgr_local[4].mpool + 4) = 0x20;
      }
    }
  }
  return (HPDF_FontDef)mmgr_local;
}

Assistant:

HPDF_FontDef
HPDF_TTFontDef_New (HPDF_MMgr   mmgr)
{
    HPDF_FontDef fontdef;
    HPDF_TTFontDefAttr fontdef_attr;

    HPDF_PTRACE ((" HPDF_TTFontDef_New\n"));

    if (!mmgr)
        return NULL;

    fontdef = HPDF_GetMem (mmgr, sizeof(HPDF_FontDef_Rec));
    if (!fontdef)
        return NULL;

    HPDF_MemSet (fontdef, 0, sizeof(HPDF_FontDef_Rec));
    fontdef->sig_bytes = HPDF_FONTDEF_SIG_BYTES;
    fontdef->mmgr = mmgr;
    fontdef->error = mmgr->error;
    fontdef->type = HPDF_FONTDEF_TYPE_TRUETYPE;
    fontdef->clean_fn = CleanFunc;
    fontdef->free_fn = FreeFunc;

    fontdef_attr = HPDF_GetMem (mmgr, sizeof(HPDF_TTFontDefAttr_Rec));
    if (!fontdef_attr) {
        HPDF_FreeMem (fontdef->mmgr, fontdef);
        return NULL;
    }

    fontdef->attr = fontdef_attr;
    HPDF_MemSet ((HPDF_BYTE *)fontdef_attr, 0, sizeof(HPDF_TTFontDefAttr_Rec));
    fontdef->flags = HPDF_FONT_STD_CHARSET;

    return fontdef;
}